

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_easy.cpp
# Opt level: O3

int256_t * __thiscall
primesum::S2_easy(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int64_t y,int64_t z,
                 int64_t c,int threads)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  byte bVar35;
  undefined1 auVar36 [16];
  undefined1 x_00 [16];
  undefined1 n [16];
  undefined1 x_01 [16];
  undefined1 n_00 [16];
  undefined1 x_02 [16];
  undefined1 n_01 [16];
  undefined1 limit [16];
  undefined1 limit_00 [16];
  undefined1 limit_01 [16];
  pointer plVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  pointer p_Var41;
  pointer pPVar42;
  ulong uVar43;
  ulong uVar44;
  pointer pPVar45;
  long lVar46;
  pointer pPVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  pointer pPVar51;
  pointer pPVar52;
  long lVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  undefined4 in_register_0000008c;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  pointer pPVar63;
  ulong uVar64;
  int256_t *piVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  PiTable pi_2;
  S2Status status;
  vector<__int128,_std::allocator<__int128>_> prime_sums;
  vector<long,_std::allocator<long>_> primes;
  int256_t phi_xn_sum;
  PiTable pi;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_190;
  long local_188;
  pointer local_178;
  pointer local_170;
  pointer pPStack_168;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  pointer local_148;
  undefined1 local_140 [40];
  long local_118;
  ulong local_110;
  vector<__int128,_std::allocator<__int128>_> local_108;
  vector<long,_std::allocator<long>_> local_f0;
  int256_t local_d8;
  int256_t local_b8;
  PiTable local_98;
  int256_t *local_78;
  int64_t local_70;
  double local_68;
  long local_60;
  int256_t local_58;
  
  pPVar52 = (pointer)CONCAT44(in_register_0000008c,threads);
  pcVar1 = local_140 + 0x10;
  local_140._0_8_ = pcVar1;
  local_70 = c;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  print((string *)local_140);
  if ((pointer)local_140._0_8_ != pcVar1) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  local_140._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"=== S2_easy(x, y) ===","");
  print((string *)local_140);
  if ((pointer)local_140._0_8_ != pcVar1) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  local_140._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"Computation of the easy special leaves","");
  print((string *)local_140);
  if ((pointer)local_140._0_8_ != pcVar1) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  auVar70._8_8_ = in_stack_fffffffffffffe10;
  auVar70._0_8_ = in_stack_fffffffffffffe08;
  print(this,(int128_t)auVar70,y,z,threads);
  local_68 = get_time();
  *(undefined8 *)&__return_storage_ptr__->low = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->high = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
  local_78 = __return_storage_ptr__;
  if (z < 0x100000000) {
    generate_primes<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,z);
    generate_prime_sums<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,z);
    dVar33 = (double)__floatuntidf(this,y);
    dVar33 = pow(dVar33,0.3333333333333333);
    auVar71 = __fixunsdfti(SUB84(dVar33,0));
    if (y < 1) {
      while( true ) {
        lVar58 = auVar71._8_8_;
        uVar59 = auVar71._0_8_;
        if (uVar59 == 0 && lVar58 == 0) break;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar59;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar59;
        uVar62 = SUB168(auVar72 * auVar20,8) + uVar59 * lVar58 * 2;
        auVar70 = __udivti3(this,y,uVar59,lVar58);
        if (uVar62 <= auVar70._8_8_ &&
            (ulong)(auVar70._0_8_ < SUB168(auVar72 * auVar20,0)) <= auVar70._8_8_ - uVar62)
        goto LAB_00123bda;
        auVar71._8_8_ = lVar58 + -1 + (ulong)(uVar59 != 0);
        auVar71._0_8_ = uVar59 - 1;
      }
      auVar71 = ZEXT816(0);
LAB_00123bda:
      do {
        auVar70 = auVar71;
        uVar62 = auVar70._0_8_;
        uVar64 = uVar62 + 1;
        lVar58 = auVar70._8_8_ + (ulong)(0xfffffffffffffffe < uVar62);
        auVar71._8_8_ = lVar58;
        auVar71._0_8_ = uVar64;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar64;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar64;
        uVar59 = SUB168(auVar9 * auVar25,8) + uVar64 * lVar58 * 2;
        auVar72 = __udivti3(this,y,uVar64,lVar58);
      } while (uVar59 <= auVar72._8_8_ &&
               (ulong)(auVar72._0_8_ < SUB168(auVar9 * auVar25,0)) <= auVar72._8_8_ - uVar59);
      ideal_num_threads((int)x,uVar62,1000);
      PiTable::PiTable((PiTable *)&local_178,z);
      dVar33 = (double)z;
      if (dVar33 < 0.0) {
        dVar33 = sqrt(dVar33);
      }
      else {
        dVar33 = SQRT(dVar33);
      }
      uVar59 = 0xb504f333;
      if ((long)dVar33 < 0xb504f333) {
        uVar59 = (long)dVar33;
      }
      lVar58 = uVar59 * 2;
      do {
        lVar46 = uVar59 * uVar59;
        uVar59 = uVar59 - 1;
        lVar58 = lVar58 + -2;
      } while (lVar46 - z != 0 && z <= lVar46);
      do {
        uVar59 = uVar59 + 1;
        lVar58 = lVar58 + 2;
      } while (lVar58 < (long)(z - uVar59 * uVar59));
      uVar64 = uVar59 >> 2 & 0xfffffffffffffff0;
      lVar58 = *(long *)((long)&local_178->prime_count + uVar64);
      uVar62 = uVar62 >> 2 & 0xfffffffffffffff0;
      lVar46 = *(long *)((long)&local_178->bits + uVar64);
      lVar53 = POPCOUNT((ulong)(*(long *)((long)&local_178->bits + uVar62) << (~auVar70[0] & 0x3f))
                        >> (~auVar70[0] & 0x3f)) + *(long *)((long)&local_178->prime_count + uVar62)
      ;
      x_02._8_8_ = in_stack_fffffffffffffe10;
      x_02._0_8_ = in_stack_fffffffffffffe08;
      S2Status::S2Status((S2Status *)local_140,(int128_t)x_02);
      pPVar47 = (pointer)(POPCOUNT((ulong)(lVar46 << (~(byte)uVar59 & 0x3f)) >>
                                   (~(byte)uVar59 & 0x3f)) + lVar58);
      if ((long)pPVar47 <= (long)pPVar52) {
        pPVar47 = pPVar52;
      }
      if ((long)pPVar47 < lVar53) {
        local_118 = lVar53 >> 0x3f;
        auVar34 = ZEXT816(0);
        local_110 = z >> 0x3f;
        do {
          plVar37 = local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_150 = (pointer)((long)&pPVar47->prime_count + 1);
          pPVar52 = (pointer)CONCAT44(0,*(uint *)((long)local_f0.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                 (long)pPVar47 * 4 + 4));
          auVar70 = __udivti3(this,y,pPVar52,0);
          uVar50 = auVar70._8_8_;
          uVar43 = auVar70._0_8_;
          auVar71 = __udivti3(uVar43,uVar50,pPVar52,0);
          uVar59 = (ulong)(auVar71._0_8_ < (ulong)z);
          uVar62 = auVar71._8_8_ - local_110;
          uVar64 = auVar71._0_8_;
          if (local_110 <= auVar71._8_8_ && uVar59 <= uVar62) {
            uVar64 = z;
          }
          dVar33 = (double)__floatuntidf(uVar43,uVar50,uVar62 - uVar59);
          auVar71 = __fixunsdfti(SUB84(SQRT(dVar33),0));
          p_Var41 = local_108.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pPVar51 = local_178;
          lVar58 = 0;
          pPVar63 = (pointer)(-(ulong)(auVar71._8_8_ != 0) | auVar71._0_8_);
          do {
            lVar46 = lVar58;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = pPVar63;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = pPVar63;
            uVar59 = SUB168(auVar12 * auVar28,8) + (long)pPVar63 * lVar46 * 2;
            pPVar42 = pPVar63;
            lVar58 = lVar46 + -1 + (ulong)(pPVar63 != (pointer)0x0);
            pPVar63 = (pointer)((long)&pPVar63[-1].bits + 7);
          } while (uVar50 < uVar59 ||
                   uVar50 - uVar59 < (ulong)(uVar43 < SUB168(auVar12 * auVar28,0)));
          do {
            pPVar63 = pPVar42;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = pPVar63;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = pPVar63;
            auVar40._8_8_ = SUB168(auVar13 * auVar29,8) + (long)pPVar63 * lVar46 * 2;
            auVar40._0_8_ = SUB168(auVar13 * auVar29,0);
            uVar59 = SUB168(auVar70 - auVar40,8);
            uVar62 = lVar46 << 1 | (ulong)pPVar63 >> 0x3f;
            lVar46 = lVar46 + (ulong)((pointer)0xfffffffffffffffe < pPVar63);
            pPVar42 = (pointer)((long)&pPVar63->prime_count + 1);
          } while (uVar62 < uVar59 ||
                   uVar62 - uVar59 <
                   (ulong)((ulong)((long)pPVar63 * 2) < SUB168(auVar70 - auVar40,0)));
          pPVar45 = (pointer)(local_70 / (long)pPVar52);
          pPVar42 = (pointer)(z / (long)pPVar52);
          if (z / (long)pPVar52 <= (long)pPVar52) {
            pPVar42 = pPVar52;
          }
          local_158 = (pointer)z;
          if ((long)pPVar63 < z) {
            local_158 = pPVar63;
          }
          if ((long)pPVar63 < (long)pPVar42) {
            local_158 = pPVar42;
          }
          pPVar63 = (pointer)z;
          if ((long)pPVar45 < z) {
            pPVar63 = pPVar45;
          }
          if ((long)pPVar45 < (long)pPVar42) {
            pPVar63 = pPVar42;
          }
          uVar59 = uVar64 >> 2 & 0xfffffffffffffff0;
          lVar46 = POPCOUNT((ulong)(*(long *)((long)&local_178->bits + uVar59) <<
                                   (~(byte)uVar64 & 0x3f)) >> (~(byte)uVar64 & 0x3f)) +
                   *(long *)((long)&local_178->prime_count + uVar59);
          uVar59 = (ulong)local_158 >> 2 & 0xfffffffffffffff0;
          local_148 = (pointer)(POPCOUNT((ulong)(*(long *)((long)&local_178->bits + uVar59) <<
                                                (~(byte)local_158 & 0x3f)) >>
                                         (~(byte)local_158 & 0x3f)) +
                               *(long *)((long)&local_178->prime_count + uVar59));
          uVar59 = (ulong)pPVar63 >> 2 & 0xfffffffffffffff0;
          lVar58 = POPCOUNT((ulong)(*(long *)((long)&local_178->bits + uVar59) <<
                                   (~(byte)pPVar63 & 0x3f)) >> (~(byte)pPVar63 & 0x3f)) +
                   *(long *)((long)&local_178->prime_count + uVar59);
          if ((long)local_148 < lVar46) {
            lVar57 = *(long *)((long)local_108.
                                     super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                                     .super__Vector_impl_data._M_start + (long)pPVar47 * 8);
            lVar60 = lVar46;
            do {
              uVar59 = (ulong)*(uint *)((long)plVar37 + lVar60 * 4);
              if (uVar50 == 0) {
                uVar59 = uVar43 / uVar59;
              }
              else {
                uVar59 = __udivti3(uVar43,uVar50,uVar59,0);
              }
              uVar62 = uVar59 >> 2 & 0xfffffffffffffff0;
              lVar46 = POPCOUNT((ulong)(*(long *)((long)&pPVar51->bits + uVar62) <<
                                       (~(byte)uVar59 & 0x3f)) >> (~(byte)uVar59 & 0x3f)) +
                       *(long *)((long)&pPVar51->prime_count + uVar62);
              lVar56 = *(long *)((long)p_Var41 + lVar46 * 8);
              uVar59 = (ulong)*(uint *)((long)plVar37 + lVar46 * 4 + 4);
              if (uVar50 == 0) {
                pPVar63 = (pointer)(uVar43 / uVar59);
              }
              else {
                pPVar63 = (pointer)__udivti3(uVar43,uVar50,uVar59,0);
              }
              if ((long)pPVar63 <= (long)local_158) {
                pPVar63 = local_158;
              }
              uVar59 = (ulong)pPVar63 >> 2 & 0xfffffffffffffff0;
              lVar46 = POPCOUNT((ulong)(*(long *)((long)&pPVar51->bits + uVar59) <<
                                       (~(byte)pPVar63 & 0x3f)) >> (~(byte)pPVar63 & 0x3f)) +
                       *(long *)((long)&pPVar51->prime_count + uVar59);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = (lVar56 - lVar57) + 1;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = pPVar52;
              uVar59 = *(long *)((long)p_Var41 + lVar60 * 8) - *(long *)((long)p_Var41 + lVar46 * 8)
              ;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = SUB168(auVar14 * auVar30,0);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar59;
              auVar36._8_8_ = SUB168(auVar15 * auVar31,8) + SUB168(auVar14 * auVar30,8) * uVar59;
              auVar36._0_8_ = SUB168(auVar15 * auVar31,0);
              auVar34 = auVar34 + auVar36;
              lVar60 = lVar46;
            } while ((long)local_148 < lVar46);
          }
          p_Var41 = local_108.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (lVar58 < lVar46) {
            lVar57 = *(long *)((long)local_108.
                                     super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                                     .super__Vector_impl_data._M_start + (long)pPVar47 * 8);
            do {
              uVar59 = (ulong)*(uint *)((long)plVar37 + lVar46 * 4);
              if (uVar50 == 0) {
                uVar62 = uVar43 / uVar59;
              }
              else {
                uVar62 = __udivti3(uVar43,uVar50,uVar59,0);
              }
              uVar64 = uVar62 >> 2 & 0xfffffffffffffff0;
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   (*(long *)((long)p_Var41 +
                             (POPCOUNT((ulong)(*(long *)((long)&pPVar51->bits + uVar64) <<
                                              (~(byte)uVar62 & 0x3f)) >> (~(byte)uVar62 & 0x3f)) +
                             *(long *)((long)&pPVar51->prime_count + uVar64)) * 8) - lVar57) + 1;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar59 * (long)pPVar52;
              auVar34 = auVar16 * auVar32 + auVar34;
              lVar46 = lVar46 + -1;
            } while (lVar58 < lVar46);
          }
          bVar66 = is_print();
          pPVar47 = local_150;
          if (bVar66) {
            n_01._8_8_ = in_stack_fffffffffffffe10;
            n_01._0_8_ = in_stack_fffffffffffffe08;
            limit_01._8_8_ = in_stack_fffffffffffffe20;
            limit_01._0_8_ = in_stack_fffffffffffffe18;
            S2Status::print((S2Status *)local_140,(int128_t)n_01,(int128_t)limit_01);
          }
        } while ((long)pPVar47 < lVar53);
      }
      else {
        auVar34 = ZEXT816(0);
      }
      piVar65 = local_78;
      if (local_178 != (pointer)0x0) {
        operator_delete(local_178,(long)pPStack_168 - (long)local_178);
      }
      local_190 = 0;
      local_188 = 0;
    }
    else {
      while( true ) {
        lVar58 = auVar71._8_8_;
        uVar59 = auVar71._0_8_;
        if (uVar59 == 0 && lVar58 == 0) break;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar59;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar59;
        uVar62 = SUB168(auVar4 * auVar19,8) + uVar59 * lVar58 * 2;
        auVar70 = __udivti3(this,y,uVar59,lVar58);
        if (uVar62 <= auVar70._8_8_ &&
            (ulong)(auVar70._0_8_ < SUB168(auVar4 * auVar19,0)) <= auVar70._8_8_ - uVar62)
        goto LAB_00123b43;
        auVar71._8_8_ = lVar58 + -1 + (ulong)(uVar59 != 0);
        auVar71._0_8_ = uVar59 - 1;
      }
      auVar71 = ZEXT816(0);
LAB_00123b43:
      do {
        auVar70 = auVar71;
        uVar62 = auVar70._0_8_;
        uVar64 = uVar62 + 1;
        lVar58 = auVar70._8_8_ + (ulong)(0xfffffffffffffffe < uVar62);
        auVar71._8_8_ = lVar58;
        auVar71._0_8_ = uVar64;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar64;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar64;
        uVar59 = SUB168(auVar8 * auVar24,8) + uVar64 * lVar58 * 2;
        auVar72 = __udivti3(this,y,uVar64,lVar58);
      } while (uVar59 <= auVar72._8_8_ &&
               (ulong)(auVar72._0_8_ < SUB168(auVar8 * auVar24,0)) <= auVar72._8_8_ - uVar59);
      ideal_num_threads((int)x,uVar62,1000);
      PiTable::PiTable(&local_98,z);
      dVar33 = (double)z;
      if (dVar33 < 0.0) {
        dVar33 = sqrt(dVar33);
      }
      else {
        dVar33 = SQRT(dVar33);
      }
      uVar59 = 0xb504f333;
      if ((long)dVar33 < 0xb504f333) {
        uVar59 = (long)dVar33;
      }
      lVar58 = uVar59 * 2;
      do {
        lVar46 = uVar59 * uVar59;
        uVar59 = uVar59 - 1;
        lVar58 = lVar58 + -2;
      } while (lVar46 - z != 0 && z <= lVar46);
      do {
        uVar59 = uVar59 + 1;
        lVar58 = lVar58 + 2;
      } while (lVar58 < (long)(z - uVar59 * uVar59));
      uVar64 = uVar59 >> 2 & 0xfffffffffffffff0;
      lVar58 = *(long *)((long)&(local_98.pi_.
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar64);
      uVar62 = uVar62 >> 2 & 0xfffffffffffffff0;
      lVar46 = *(long *)((long)&(local_98.pi_.
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bits + uVar64);
      lVar53 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                         uVar62) << (~auVar70[0] & 0x3f)) >> (~auVar70[0] & 0x3f)) +
               *(long *)((long)&(local_98.pi_.
                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar62);
      x_01._8_8_ = in_stack_fffffffffffffe10;
      x_01._0_8_ = in_stack_fffffffffffffe08;
      S2Status::S2Status((S2Status *)local_140,(int128_t)x_01);
      pPVar47 = (pointer)(POPCOUNT((ulong)(lVar46 << (~(byte)uVar59 & 0x3f)) >>
                                   (~(byte)uVar59 & 0x3f)) + lVar58);
      if ((long)pPVar47 <= (long)pPVar52) {
        pPVar47 = pPVar52;
      }
      local_190 = 0;
      local_188 = 0;
      local_1c0 = 0;
      uVar59 = 0;
      if ((long)pPVar47 < lVar53) {
        local_60 = lVar53 >> 0x3f;
        local_190 = 0;
        local_188 = 0;
        local_1c0 = 0;
        uVar59 = 0;
        uVar64 = 0;
        local_1d8 = 0;
        uVar62 = 0;
        lVar58 = 0;
        local_118 = lVar53;
        local_110 = z >> 0x3f;
        do {
          local_150 = (pointer)((long)&pPVar47->prime_count + 1);
          pPVar52 = (pointer)(ulong)*(uint *)((long)local_f0.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                             (long)pPVar47 * 4 + 4);
          auVar70 = __udivti3(this,y,pPVar52,0);
          uVar49 = auVar70._8_8_;
          uVar48 = auVar70._0_8_;
          auVar71 = __udivti3(uVar48,uVar49,pPVar52,0);
          uVar43 = (ulong)(auVar71._0_8_ < (ulong)z);
          uVar50 = auVar71._8_8_ - local_110;
          uVar44 = auVar71._0_8_;
          if (local_110 <= auVar71._8_8_ && uVar43 <= uVar50) {
            uVar44 = z;
          }
          dVar33 = (double)__floatuntidf(uVar48,uVar49,uVar50 - uVar43);
          auVar71 = __fixunsdfti(SUB84(SQRT(dVar33),0));
          lVar46 = 0;
          pPVar51 = (pointer)(-(ulong)(auVar71._8_8_ != 0) | auVar71._0_8_);
          do {
            lVar53 = lVar46;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pPVar51;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = pPVar51;
            uVar43 = SUB168(auVar10 * auVar26,8) + (long)pPVar51 * lVar53 * 2;
            pPVar63 = pPVar51;
            lVar46 = lVar53 + -1 + (ulong)(pPVar51 != (pointer)0x0);
            pPVar51 = (pointer)((long)&pPVar51[-1].bits + 7);
          } while (uVar49 < uVar43 ||
                   uVar49 - uVar43 < (ulong)(uVar48 < SUB168(auVar10 * auVar26,0)));
          do {
            pPVar51 = pPVar63;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = pPVar51;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = pPVar51;
            auVar39._8_8_ = SUB168(auVar11 * auVar27,8) + (long)pPVar51 * lVar53 * 2;
            auVar39._0_8_ = SUB168(auVar11 * auVar27,0);
            uVar43 = SUB168(auVar70 - auVar39,8);
            uVar50 = lVar53 << 1 | (ulong)pPVar51 >> 0x3f;
            lVar53 = lVar53 + (ulong)((pointer)0xfffffffffffffffe < pPVar51);
            pPVar63 = (pointer)((long)&pPVar51->prime_count + 1);
          } while (uVar50 < uVar43 ||
                   uVar50 - uVar43 <
                   (ulong)((ulong)((long)pPVar51 * 2) < SUB168(auVar70 - auVar39,0)));
          pPVar42 = (pointer)(local_70 / (long)pPVar52);
          pPVar63 = (pointer)(z / (long)pPVar52);
          if (z / (long)pPVar52 <= (long)pPVar52) {
            pPVar63 = pPVar52;
          }
          local_148 = (pointer)z;
          if ((long)pPVar51 < z) {
            local_148 = pPVar51;
          }
          if ((long)pPVar51 < (long)pPVar63) {
            local_148 = pPVar63;
          }
          pPVar51 = (pointer)z;
          if ((long)pPVar42 < z) {
            pPVar51 = pPVar42;
          }
          if ((long)pPVar42 < (long)pPVar63) {
            pPVar51 = pPVar63;
          }
          uVar50 = uVar44 >> 2 & 0xfffffffffffffff0;
          bVar35 = (byte)local_148;
          uVar43 = (ulong)local_148 >> 2 & 0xfffffffffffffff0;
          lVar46 = *(long *)((long)&(local_98.pi_.
                                     super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->bits + uVar43);
          lVar53 = *(long *)((long)&(local_98.pi_.
                                     super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                            uVar43);
          uVar43 = (ulong)pPVar51 >> 2 & 0xfffffffffffffff0;
          local_158 = (pointer)(POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                                                      
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar43) << (~(byte)pPVar51 & 0x3f)) >>
                                         (~(byte)pPVar51 & 0x3f)) +
                               *(long *)((long)&(local_98.pi_.
                                                 super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                prime_count + uVar43));
          lVar57 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                            
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                             uVar50) << (~(byte)uVar44 & 0x3f)) >>
                            (~(byte)uVar44 & 0x3f)) +
                   *(long *)((long)&(local_98.pi_.
                                     super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                            uVar50);
          plVar37 = local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while (local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start = plVar37,
                POPCOUNT((ulong)(lVar46 << (~bVar35 & 0x3f)) >> (~bVar35 & 0x3f)) + lVar53 < lVar57)
          {
            uVar59 = (ulong)*(uint *)((long)plVar37 + lVar57 * 4);
            if (uVar49 == 0) {
              uVar59 = uVar48 / uVar59;
            }
            else {
              uVar59 = __udivti3(uVar48,uVar49,uVar59,0);
            }
            pPVar51 = local_98.pi_.
                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar43 = uVar59 >> 2 & 0xfffffffffffffff0;
            lVar60 = *(long *)((long)&(local_98.pi_.
                                       super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                              uVar43);
            lVar56 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                                
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                               uVar43) << (~(byte)uVar59 & 0x3f)) >>
                              (~(byte)uVar59 & 0x3f));
            local_b8.low._0_8_ =
                 (*(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (lVar56 + lVar60) * 8)
                 - *(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pPVar47 * 8)) +
                 1;
            local_b8.low._8_8_ = 0;
            local_b8.high._0_8_ = 0;
            local_b8.high._8_8_ = 0;
            uVar59 = (ulong)*(uint *)((long)plVar37 + lVar60 * 4 + lVar56 * 4 + 4);
            if (uVar49 == 0) {
              pPVar63 = (pointer)(uVar48 / uVar59);
            }
            else {
              pPVar63 = (pointer)__udivti3(uVar48,uVar49,uVar59,0);
            }
            if ((long)pPVar63 <= (long)local_148) {
              pPVar63 = local_148;
            }
            uVar59 = (ulong)pPVar63 >> 2 & 0xfffffffffffffff0;
            lVar60 = POPCOUNT((ulong)(*(long *)((long)&pPVar51->bits + uVar59) <<
                                     (~(byte)pPVar63 & 0x3f)) >> (~(byte)pPVar63 & 0x3f)) +
                     *(long *)((long)&pPVar51->prime_count + uVar59);
            local_170 = (pointer)0x0;
            pPStack_168 = (pointer)0x0;
            local_160 = (pointer)0x0;
            local_178 = pPVar52;
            int256_t::operator*(&local_58,&local_b8,(int256_t *)&local_178);
            local_178 = (pointer)(*(long *)((long)local_108.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar57 * 8) -
                                 *(long *)((long)local_108.
                                                 super__Vector_base<__int128,_std::allocator<__int128>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                          lVar60 * 8));
            local_170 = (pointer)0x0;
            pPStack_168 = (pointer)0x0;
            local_160 = (pointer)0x0;
            int256_t::operator*(&local_d8,&local_58,(int256_t *)&local_178);
            bVar66 = CARRY8(uVar62,(ulong)local_d8.high);
            uVar50 = uVar62 + (ulong)local_d8.high;
            bVar67 = CARRY8(uVar64,(ulong)local_d8.low);
            uVar64 = uVar64 + (ulong)local_d8.low;
            uVar59 = local_1d8 + local_d8.low._8_8_ + (ulong)bVar67;
            uVar43 = (ulong)(CARRY8(local_1d8,local_d8.low._8_8_) ||
                            CARRY8(local_1d8 + local_d8.low._8_8_,(ulong)bVar67));
            uVar62 = uVar50 + uVar43;
            lVar58 = lVar58 + local_d8.high._8_8_ + (ulong)bVar66 + (ulong)CARRY8(uVar50,uVar43);
            lVar57 = lVar60;
            local_1d8 = uVar59;
            local_1c0 = uVar64;
            local_190 = uVar62;
            local_188 = lVar58;
            plVar37 = local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          if ((long)local_158 < lVar57) {
            do {
              uVar59 = (ulong)*(uint *)((long)local_f0.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar57 * 4)
              ;
              if (uVar49 == 0) {
                uVar43 = uVar48 / uVar59;
              }
              else {
                uVar43 = __udivti3(uVar48,uVar49,uVar59,0);
              }
              uVar50 = uVar43 >> 2 & 0xfffffffffffffff0;
              local_b8.low._0_8_ =
                   (*(long *)((long)local_108.
                                    super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                             (POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                                                  
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar50) << (~(byte)uVar43 & 0x3f)) >>
                                       (~(byte)uVar43 & 0x3f)) +
                             *(long *)((long)&(local_98.pi_.
                                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                              prime_count + uVar50)) * 8) -
                   *(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pPVar47 * 8)) +
                   1;
              local_b8.low._8_8_ = 0;
              local_b8.high._0_8_ = 0;
              local_b8.high._8_8_ = 0;
              local_178 = (pointer)(uVar59 * (long)pPVar52);
              local_170 = (pointer)0x0;
              pPStack_168 = (pointer)0x0;
              local_160 = (pointer)0x0;
              int256_t::operator*(&local_d8,&local_b8,(int256_t *)&local_178);
              local_1c0 = uVar64 + (ulong)local_d8.low;
              uVar59 = local_1d8 + local_d8.low._8_8_ + (ulong)CARRY8(uVar64,(ulong)local_d8.low);
              uVar64 = (ulong)(CARRY8(local_1d8,local_d8.low._8_8_) ||
                              CARRY8(local_1d8 + local_d8.low._8_8_,
                                     (ulong)CARRY8(uVar64,(ulong)local_d8.low)));
              local_190 = uVar62 + (ulong)local_d8.high + uVar64;
              local_188 = lVar58 + local_d8.high._8_8_ + (ulong)CARRY8(uVar62,(ulong)local_d8.high)
                          + (ulong)CARRY8(uVar62 + (ulong)local_d8.high,uVar64);
              lVar57 = lVar57 + -1;
              uVar62 = local_190;
              lVar58 = local_188;
              uVar64 = local_1c0;
              local_1d8 = uVar59;
            } while ((long)local_158 < lVar57);
          }
          bVar66 = is_print();
          lVar46 = local_118;
          if (bVar66) {
            n_00._8_8_ = in_stack_fffffffffffffe10;
            n_00._0_8_ = in_stack_fffffffffffffe08;
            limit_00._8_8_ = in_stack_fffffffffffffe20;
            limit_00._0_8_ = in_stack_fffffffffffffe18;
            S2Status::print((S2Status *)local_140,(int128_t)n_00,(int128_t)limit_00);
          }
          pPVar47 = local_150;
        } while ((long)local_150 < lVar46);
      }
      if (local_98.pi_.
          super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.pi_.
                        super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.pi_.
                              super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.pi_.
                              super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      auVar34._8_8_ = uVar59;
      auVar34._0_8_ = local_1c0;
      piVar65 = local_78;
    }
    piVar65->low = (uint128_t)auVar34;
    *(ulong *)&piVar65->high = local_190;
    *(long *)((long)&piVar65->high + 8) = local_188;
    if (local_108.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    generate_primes<long>(&local_f0,z);
    generate_prime_sums<__int128>(&local_108,z);
    dVar33 = (double)__floatuntidf(this,y);
    dVar33 = pow(dVar33,0.3333333333333333);
    auVar69 = __fixunsdfti(SUB84(dVar33,0));
    if (auVar69._0_8_ != 0 || auVar69._8_8_ != 0) {
      do {
        lVar58 = auVar69._8_8_;
        uVar62 = auVar69._0_8_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar62;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar62;
        uVar59 = SUB168(auVar2 * auVar17,8) + uVar62 * lVar58 * 2;
        auVar70 = __udivti3(this,y,uVar62,lVar58);
        if (uVar59 <= auVar70._8_8_ &&
            (ulong)(auVar70._0_8_ < SUB168(auVar2 * auVar17,0)) <= auVar70._8_8_ - uVar59)
        goto LAB_00123240;
        lVar58 = lVar58 + -1 + (ulong)(uVar62 != 0);
        auVar69._8_8_ = lVar58;
        auVar69._0_8_ = uVar62 - 1;
      } while (uVar62 - 1 != 0 || lVar58 != 0);
    }
    auVar69 = ZEXT816(0);
LAB_00123240:
    do {
      auVar70 = auVar69;
      uVar62 = auVar70._0_8_;
      uVar64 = uVar62 + 1;
      lVar58 = auVar70._8_8_ + (ulong)(0xfffffffffffffffe < uVar62);
      auVar69._8_8_ = lVar58;
      auVar69._0_8_ = uVar64;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar64;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar64;
      uVar59 = SUB168(auVar3 * auVar18,8) + uVar64 * lVar58 * 2;
      auVar71 = __udivti3(this,y,uVar64,lVar58);
    } while (uVar59 <= auVar71._8_8_ &&
             (ulong)(auVar71._0_8_ < SUB168(auVar3 * auVar18,0)) <= auVar71._8_8_ - uVar59);
    ideal_num_threads((int)x,uVar62,1000);
    PiTable::PiTable(&local_98,z);
    dVar33 = (double)z;
    if (dVar33 < 0.0) {
      dVar33 = sqrt(dVar33);
    }
    else {
      dVar33 = SQRT(dVar33);
    }
    uVar59 = 0xb504f333;
    if ((long)dVar33 < 0xb504f333) {
      uVar59 = (long)dVar33;
    }
    lVar58 = uVar59 * 2;
    do {
      lVar46 = uVar59 * uVar59;
      uVar59 = uVar59 - 1;
      lVar58 = lVar58 + -2;
    } while (lVar46 - z != 0 && z <= lVar46);
    do {
      uVar59 = uVar59 + 1;
      lVar58 = lVar58 + 2;
    } while (lVar58 < (long)(z - uVar59 * uVar59));
    uVar64 = uVar59 >> 2 & 0xfffffffffffffff0;
    lVar58 = *(long *)((long)&(local_98.pi_.
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar64);
    uVar62 = uVar62 >> 2 & 0xfffffffffffffff0;
    lVar46 = *(long *)((long)&(local_98.pi_.
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bits + uVar64);
    uVar62 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->bits +
                                       uVar62) << (~auVar70[0] & 0x3f)) >> (~auVar70[0] & 0x3f)) +
             *(long *)((long)&(local_98.pi_.
                               super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar62);
    x_00._8_8_ = in_stack_fffffffffffffe10;
    x_00._0_8_ = in_stack_fffffffffffffe08;
    S2Status::S2Status((S2Status *)local_140,(int128_t)x_00);
    pPVar47 = (pointer)(POPCOUNT((ulong)(lVar46 << (~(byte)uVar59 & 0x3f)) >> (~(byte)uVar59 & 0x3f)
                                ) + lVar58);
    if ((long)pPVar47 <= (long)pPVar52) {
      pPVar47 = pPVar52;
    }
    local_1d8 = 0;
    local_1d0 = 0;
    uVar59 = 0;
    lVar58 = 0;
    if ((long)pPVar47 < (long)uVar62) {
      local_118 = (long)uVar62 >> 0x3f;
      local_1d8 = 0;
      local_1d0 = 0;
      uVar59 = 0;
      lVar58 = 0;
      local_1b8 = 0;
      uVar64 = 0;
      lVar46 = 0;
      local_110 = uVar62;
      do {
        pPVar52 = (pointer)((long)&pPVar47->prime_count + 1);
        pPVar51 = (pointer)local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)((long)&pPVar47->prime_count + 1)]
        ;
        pPVar63 = (pointer)((long)pPVar51 >> 0x3f);
        local_158 = pPVar47;
        auVar70 = __udivti3(this,y,pPVar51,pPVar63);
        uVar44 = auVar70._8_8_;
        uVar50 = auVar70._0_8_;
        local_148 = pPVar63;
        auVar71 = __udivti3(uVar50,uVar44,pPVar51,pPVar63);
        uVar62 = (ulong)(auVar71._0_8_ < (ulong)z);
        uVar43 = auVar71._0_8_;
        if (uVar62 <= auVar71._8_8_) {
          uVar43 = z;
        }
        dVar33 = (double)__floatuntidf(uVar50,uVar44,auVar71._8_8_ - uVar62);
        auVar71 = __fixunsdfti(SUB84(SQRT(dVar33),0));
        pPVar47 = (pointer)(-(ulong)(auVar71._8_8_ != 0) | auVar71._0_8_);
        lVar53 = 0;
        do {
          lVar57 = lVar53;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pPVar47;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = pPVar47;
          uVar62 = SUB168(auVar5 * auVar21,8) + (long)pPVar47 * lVar57 * 2;
          bVar66 = pPVar47 != (pointer)0x0;
          pPVar63 = pPVar47;
          pPVar47 = (pointer)((long)&pPVar47[-1].bits + 7);
          lVar53 = lVar57 + -1 + (ulong)bVar66;
        } while (uVar44 < uVar62 || uVar44 - uVar62 < (ulong)(uVar50 < SUB168(auVar5 * auVar21,0)));
        do {
          pPVar47 = pPVar63;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pPVar47;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = pPVar47;
          auVar38._8_8_ = SUB168(auVar6 * auVar22,8) + (long)pPVar47 * lVar57 * 2;
          auVar38._0_8_ = SUB168(auVar6 * auVar22,0);
          uVar62 = SUB168(auVar70 - auVar38,8);
          uVar48 = lVar57 << 1 | (ulong)pPVar47 >> 0x3f;
          lVar57 = lVar57 + (ulong)((pointer)0xfffffffffffffffe < pPVar47);
          pPVar63 = (pointer)((long)&pPVar47->prime_count + 1);
        } while (uVar48 < uVar62 ||
                 uVar48 - uVar62 < (ulong)((ulong)((long)pPVar47 * 2) < SUB168(auVar70 - auVar38,0))
                );
        pPVar42 = (pointer)(local_70 / (long)pPVar51);
        pPVar63 = (pointer)(z / (long)pPVar51);
        if (z / (long)pPVar51 <= (long)pPVar51) {
          pPVar63 = pPVar51;
        }
        local_150 = (pointer)z;
        if ((long)pPVar47 < z) {
          local_150 = pPVar47;
        }
        if ((long)pPVar47 < (long)pPVar63) {
          local_150 = pPVar63;
        }
        pPVar47 = (pointer)z;
        if ((long)pPVar42 < z) {
          pPVar47 = pPVar42;
        }
        if ((long)pPVar42 < (long)pPVar63) {
          pPVar47 = pPVar63;
        }
        uVar62 = uVar43 >> 2 & 0xfffffffffffffff0;
        lVar60 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                        
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                           uVar62) << (~(byte)uVar43 & 0x3f)) >>
                          (~(byte)uVar43 & 0x3f)) +
                 *(long *)((long)&(local_98.pi_.
                                   super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar62)
        ;
        uVar62 = (ulong)local_150 >> 2 & 0xfffffffffffffff0;
        lVar56 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                        
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                           uVar62) << (~(byte)local_150 & 0x3f)) >>
                          (~(byte)local_150 & 0x3f)) +
                 *(long *)((long)&(local_98.pi_.
                                   super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar62)
        ;
        uVar62 = (ulong)pPVar47 >> 2 & 0xfffffffffffffff0;
        lVar53 = *(long *)((long)&(local_98.pi_.
                                   super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->bits + uVar62);
        lVar57 = *(long *)((long)&(local_98.pi_.
                                   super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prime_count + uVar62)
        ;
        if (lVar56 < lVar60) {
          local_1d0 = local_1b8;
          lVar61 = lVar60;
          do {
            plVar37 = local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar59 = local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar61];
            if (uVar44 == 0) {
              uVar59 = uVar50 / uVar59;
            }
            else {
              uVar59 = __udivti3(uVar50,uVar44,uVar59,(long)uVar59 >> 0x3f);
            }
            pPVar63 = local_98.pi_.
                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar62 = uVar59 >> 2 & 0xfffffffffffffff0;
            lVar58 = *(long *)((long)&(local_98.pi_.
                                       super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                              uVar62);
            lVar60 = POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                                
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                               uVar62) << (~(byte)uVar59 & 0x3f)) >>
                              (~(byte)uVar59 & 0x3f));
            uVar54 = (int)lVar60 << 4;
            lVar55 = lVar58 * 0x10;
            uVar59 = *(ulong *)((long)local_108.
                                      super__Vector_base<__int128,_std::allocator<__int128>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                               lVar55 + (ulong)uVar54);
            uVar62 = uVar59 - *(ulong *)(local_108.
                                         super__Vector_base<__int128,_std::allocator<__int128>_>.
                                         _M_impl.super__Vector_impl_data._M_start + (long)local_158)
            ;
            local_b8.low._0_8_ = uVar62 + 1;
            local_b8.low._8_8_ =
                 ((*(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            lVar55 + 8 + (ulong)uVar54) -
                  *(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                           ((long)local_158 * 2 + 1) * 8)) -
                 (ulong)(uVar59 < *(ulong *)(local_108.
                                             super__Vector_base<__int128,_std::allocator<__int128>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                            (long)local_158))) +
                 (ulong)(0xfffffffffffffffe < uVar62);
            local_b8.high._0_8_ = local_b8.low._8_8_ >> 0x3f;
            uVar59 = plVar37[lVar60 + lVar58 + 1];
            local_b8.high._8_8_ = (long)local_b8.high;
            if (uVar44 == 0) {
              pPVar42 = (pointer)(uVar50 / uVar59);
            }
            else {
              pPVar42 = (pointer)__udivti3(uVar50,uVar44,uVar59,(long)uVar59 >> 0x3f);
            }
            if ((long)pPVar42 <= (long)local_150) {
              pPVar42 = local_150;
            }
            uVar59 = (ulong)pPVar42 >> 2 & 0xfffffffffffffff0;
            lVar60 = POPCOUNT((ulong)(*(long *)((long)&pPVar63->bits + uVar59) <<
                                     (~(byte)pPVar42 & 0x3f)) >> (~(byte)pPVar42 & 0x3f)) +
                     *(long *)((long)&pPVar63->prime_count + uVar59);
            local_170 = local_148;
            local_160 = local_148;
            pPStack_168 = local_148;
            local_178 = pPVar51;
            int256_t::operator*(&local_58,&local_b8,(int256_t *)&local_178);
            local_178 = (pointer)(*(ulong *)(local_108.
                                             super__Vector_base<__int128,_std::allocator<__int128>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar61) -
                                 *(ulong *)(local_108.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar60));
            local_170 = (pointer)((*(long *)((long)local_108.
                                                                                                      
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            (lVar61 * 2 + 1) * 8) -
                                  *(long *)((long)local_108.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           (lVar60 * 2 + 1) * 8)) -
                                 (ulong)(*(ulong *)(local_108.
                                                                                                        
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar61
                                                  ) <
                                        *(ulong *)(local_108.
                                                                                                      
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar60
                                                  )));
            pPStack_168 = (pointer)((long)local_170 >> 0x3f);
            local_160 = pPStack_168;
            int256_t::operator*(&local_d8,&local_58,(int256_t *)&local_178);
            bVar66 = CARRY8(uVar64,(ulong)local_d8.high);
            uVar62 = uVar64 + (ulong)local_d8.high;
            bVar67 = CARRY8(local_1d8,(ulong)local_d8.low);
            local_1d8 = local_1d8 + (ulong)local_d8.low;
            bVar68 = CARRY8(local_1d0,local_d8.low._8_8_);
            uVar59 = local_1d0 + local_d8.low._8_8_;
            local_1d0 = uVar59 + bVar67;
            uVar59 = (ulong)(bVar68 || CARRY8(uVar59,(ulong)bVar67));
            uVar64 = uVar62 + uVar59;
            lVar46 = lVar46 + local_d8.high._8_8_ + (ulong)bVar66 + (ulong)CARRY8(uVar62,uVar59);
            lVar61 = lVar60;
            local_1b8 = local_1d0;
            uVar59 = uVar64;
            lVar58 = lVar46;
          } while (lVar56 < lVar60);
        }
        for (; POPCOUNT((ulong)(lVar53 << (~(byte)pPVar47 & 0x3f)) >> (~(byte)pPVar47 & 0x3f)) +
               lVar57 < lVar60; lVar60 = lVar60 + -1) {
          uVar59 = local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar60];
          if (uVar44 == 0) {
            uVar62 = uVar50 / uVar59;
          }
          else {
            uVar62 = __udivti3(uVar50,uVar44,uVar59,(long)uVar59 >> 0x3f);
          }
          uVar43 = uVar62 >> 2 & 0xfffffffffffffff0;
          uVar54 = (int)POPCOUNT((ulong)(*(long *)((long)&(local_98.pi_.
                                                                                                                      
                                                  super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->bits +
                                                  uVar43) << (~(byte)uVar62 & 0x3f)) >>
                                 (~(byte)uVar62 & 0x3f)) << 4;
          lVar58 = *(long *)((long)&(local_98.pi_.
                                     super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->prime_count +
                            uVar43) * 0x10;
          uVar62 = *(ulong *)((long)local_108.
                                    super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar58 + (ulong)uVar54);
          uVar43 = uVar62 - *(ulong *)(local_108.
                                       super__Vector_base<__int128,_std::allocator<__int128>_>.
                                       _M_impl.super__Vector_impl_data._M_start + (long)local_158);
          local_b8.low._0_8_ = uVar43 + 1;
          local_b8.low._8_8_ =
               ((*(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                          lVar58 + 8 + (ulong)uVar54) -
                *(long *)((long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                         ((long)local_158 * 2 + 1) * 8)) -
               (ulong)(uVar62 < *(ulong *)(local_108.
                                           super__Vector_base<__int128,_std::allocator<__int128>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                          (long)local_158))) + (ulong)(0xfffffffffffffffe < uVar43);
          local_b8.high._0_8_ = local_b8.low._8_8_ >> 0x3f;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar59;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pPVar51;
          local_178 = SUB168(auVar7 * auVar23,0);
          local_170 = (pointer)(((long)uVar59 >> 0x3f) * (long)pPVar51 +
                               uVar59 * (long)local_148 + SUB168(auVar7 * auVar23,8));
          pPStack_168 = (pointer)((long)local_170 >> 0x3f);
          local_160 = pPStack_168;
          local_b8.high._8_8_ = (long)local_b8.high;
          int256_t::operator*(&local_d8,&local_b8,(int256_t *)&local_178);
          bVar66 = CARRY8(uVar64,(ulong)local_d8.high);
          uVar62 = uVar64 + (ulong)local_d8.high;
          bVar67 = CARRY8(local_1d8,(ulong)local_d8.low);
          local_1d8 = local_1d8 + (ulong)local_d8.low;
          bVar68 = CARRY8(local_1b8,local_d8.low._8_8_);
          uVar59 = local_1b8 + local_d8.low._8_8_;
          local_1b8 = uVar59 + bVar67;
          uVar59 = (ulong)(bVar68 || CARRY8(uVar59,(ulong)bVar67));
          uVar64 = uVar62 + uVar59;
          lVar46 = lVar46 + local_d8.high._8_8_ + (ulong)bVar66 + (ulong)CARRY8(uVar62,uVar59);
          uVar59 = uVar64;
          lVar58 = lVar46;
          local_1d0 = local_1b8;
        }
        bVar66 = is_print();
        uVar62 = local_110;
        if (bVar66) {
          n._8_8_ = in_stack_fffffffffffffe10;
          n._0_8_ = in_stack_fffffffffffffe08;
          limit._8_8_ = in_stack_fffffffffffffe20;
          limit._0_8_ = in_stack_fffffffffffffe18;
          S2Status::print((S2Status *)local_140,(int128_t)n,(int128_t)limit);
        }
        pPVar47 = pPVar52;
      } while ((long)pPVar52 < (long)uVar62);
    }
    if (local_98.pi_.
        super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.pi_.
                      super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.pi_.
                            super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.pi_.
                            super__Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    piVar65 = local_78;
    *(ulong *)&local_78->low = local_1d8;
    *(ulong *)((long)&local_78->low + 8) = local_1d0;
    *(ulong *)&local_78->high = uVar59;
    *(long *)((long)&local_78->high + 8) = lVar58;
    if (local_108.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<__int128,_std::allocator<__int128>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"S2_easy","");
  print((string *)local_140,*piVar65,local_68);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  return piVar65;
}

Assistant:

int256_t S2_easy(int128_t x,
                 int64_t y,
                 int64_t z,
                 int64_t c,
                 int threads)
{
  print("");
  print("=== S2_easy(x, y) ===");
  print("Computation of the easy special leaves");
  print(x, y, c, threads);

  double time = get_time();
  int256_t s2_easy;

  // uses less memory
  if (y <= numeric_limits<uint32_t>::max())
  {
    auto primes = generate_primes<uint32_t>(y);
    auto prime_sums = generate_prime_sums<uint64_t>(y);

    if (x <= numeric_limits<uint64_t>::max())
      s2_easy = S2_easy_OpenMP<int128_t>(x, y, z, c, primes, prime_sums, threads);
    else
      s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }
  else
  {
    auto primes = generate_primes<int64_t>(y);
    auto prime_sums = generate_prime_sums<int128_t>(y);

    s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }

  print("S2_easy", s2_easy, time);
  return s2_easy;
}